

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

uint Catch::rngSeed(void)

{
  uint uVar1;
  undefined **ppuVar2;
  undefined8 *puVar3;
  
  if (IMutableContext::currentContext == (undefined8 *)0x0) {
    IMutableContext::currentContext = (undefined8 *)operator_new(0x30);
    ppuVar2 = &PTR__Context_00186cc0;
    *IMutableContext::currentContext = &PTR__Context_00186cc0;
    IMutableContext::currentContext[1] = &PTR__Context_00186d10;
    IMutableContext::currentContext[2] = 0;
    IMutableContext::currentContext[3] = 0;
    IMutableContext::currentContext[4] = 0;
    IMutableContext::currentContext[5] = 0;
  }
  else {
    ppuVar2 = (undefined **)*IMutableContext::currentContext;
  }
  puVar3 = (undefined8 *)(*(code *)ppuVar2[4])();
  uVar1 = (**(code **)(*(long *)*puVar3 + 0x88))();
  return uVar1;
}

Assistant:

unsigned int rngSeed() {
        return getCurrentContext().getConfig()->rngSeed();
    }